

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O2

void __thiscall
Hypergraph::enumerate(Hypergraph *this,edge *x,edge *y,size_type r,edge_vec *minimal_hitting_sets)

{
  int iVar1;
  time_point later;
  rep rVar2;
  long lVar3;
  reference rVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_a9;
  edge yv;
  string local_88;
  edge xv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset(&xv,x);
  rVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&xv,r);
  *rVar4.m_block = *rVar4.m_block | rVar4.m_mask;
  iVar1 = extendable(this,&xv,y);
  if (iVar1 == 0) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset(&yv,y);
    rVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&yv,r);
    *rVar4.m_block = *rVar4.m_block | rVar4.m_mask;
    enumerate(this,x,&yv,r + 1,minimal_hitting_sets);
  }
  else {
    if (iVar1 == 1) {
      enumerate(this,&xv,y,r + 1,minimal_hitting_sets);
    }
    else if (iVar1 == 2) {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(minimal_hitting_sets,&xv);
      if ((this->m_configuration).collect_hitting_set_statistics == true) {
        later.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_((string *)&yv,&xv);
        ns_string_abi_cxx11_(&local_88,(time_point)(this->m_hitting_set_timestamp).__d.__r,later);
        __l._M_len = 2;
        __l._M_array = (iterator)&yv;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,__l,&local_a9);
        Table::add_record(&this->m_hitting_set_stats,&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        lVar3 = 0x20;
        do {
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&yv.m_bits.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar3));
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != -0x20);
        rVar2 = std::chrono::_V2::system_clock::now();
        (this->m_hitting_set_timestamp).__d.__r = rVar2;
      }
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset(&yv,y);
    rVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&yv,r);
    *rVar4.m_block = *rVar4.m_block | rVar4.m_mask;
    iVar1 = extendable(this,x,&yv);
    if (iVar1 != 0) {
      enumerate(this,x,&yv,r + 1,minimal_hitting_sets);
    }
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&yv);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&xv);
  return;
}

Assistant:

void Hypergraph::enumerate(const edge &x, const edge &y, edge::size_type r, edge_vec &minimal_hitting_sets) {
	edge xv = x;
	xv[r] = 1;
	switch (extendable(xv, y)) {
	case MINIMAL:
	{
		minimal_hitting_sets.push_back(xv);
		if (m_configuration.collect_hitting_set_statistics) {
			auto now = Clock::now();
			m_hitting_set_stats.add_record({ edge_to_string(xv), ns_string(m_hitting_set_timestamp, now) });
			m_hitting_set_timestamp = Clock::now();
		}
		break;
	}
	case EXTENDABLE:
		enumerate(xv, y, r + 1, minimal_hitting_sets);
		break;
	case NOT_EXTENDABLE:
		edge yv = y;
		yv[r] = 1;
		enumerate(x, yv, r + 1, minimal_hitting_sets);
		return;
	}
	edge yv = y;
	yv[r] = 1;
	if (extendable(x, yv)) enumerate(x, yv, r + 1, minimal_hitting_sets);
}